

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O2

size_t test_memory(vector<int_*,_std::allocator<int_*>_> *memory)

{
  pointer ppiVar1;
  pointer ppiVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  size_t j;
  long lVar5;
  size_t sVar6;
  
  ppiVar1 = (memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppiVar2 = (memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::chrono::_V2::steady_clock::now();
  sVar6 = 0;
  for (iVar4 = 0; iVar4 != 0x32; iVar4 = iVar4 + 1) {
    for (lVar5 = 0; (long)ppiVar1 - (long)ppiVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
      sVar6 = sVar6 + (long)*(memory->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar5];
    }
  }
  std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar3);
  return sVar6;
}

Assistant:

size_t test_memory(const std::vector<Type*>& memory)
{
    size_t sum = 0;
    size_t size = memory.size();

    using Clock = std::chrono::steady_clock;
    auto start = Clock::now();

    for (int i = 0; i < REPETITIONS; i++)
    {
        for (size_t j = 0; j < size; j++)
        {
            sum += *memory[j];
        }
    }

    std::cerr << std::chrono::duration_cast<std::chrono::microseconds>(Clock::now() - start).count() << std::endl;
    return sum;
}